

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildReservedRange
          (DescriptorBuilder *this,ReservedRange *proto,Descriptor *parent,ReservedRange *result)

{
  ReservedRange RVar1;
  
  RVar1.start = proto->start_;
  RVar1.end = proto->end_;
  *result = RVar1;
  if (0 < RVar1.start) {
    return;
  }
  AddError(this,*(string **)(parent + 8),&proto->super_Message,NUMBER,
           "Reserved numbers must be positive integers.");
  return;
}

Assistant:

void DescriptorBuilder::BuildReservedRange(
    const DescriptorProto::ReservedRange& proto,
    const Descriptor* parent,
    Descriptor::ReservedRange* result) {
  result->start = proto.start();
  result->end = proto.end();
  if (result->start <= 0) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Reserved numbers must be positive integers.");
  }
}